

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<char_const(&)[13],QByteArray>
          (QByteArray *a,QStringBuilder<const_char_(&)[13],_QByteArray> *b,char param_3)

{
  ArrayOptions *pAVar1;
  char cVar2;
  size_t __n;
  ulong uVar3;
  char *pcVar4;
  Data *pDVar5;
  long lVar6;
  ulong uVar7;
  char *__dest;
  long lVar8;
  ulong uVar9;
  
  pDVar5 = (a->d).d;
  uVar7 = (a->d).size;
  uVar9 = uVar7 + (b->b).d.size + 0xc;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar7);
    pDVar5 = (a->d).d;
    uVar7 = (a->d).size;
    uVar3 = uVar9;
    if (pDVar5 != (Data *)0x0) goto LAB_001ab2a6;
LAB_001ab2e3:
    if (uVar3 < uVar7) {
      uVar3 = uVar7;
    }
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar3);
    pDVar5 = (a->d).d;
    if (pDVar5 != (Data *)0x0) {
      lVar6 = (pDVar5->super_QArrayData).alloc;
LAB_001ab306:
      if (lVar6 != 0) {
        pAVar1 = &(pDVar5->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_001ab30f;
    }
  }
  else {
LAB_001ab2a6:
    lVar6 = (pDVar5->super_QArrayData).alloc;
    pcVar4 = (a->d).ptr;
    lVar8 = ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar6;
    if ((long)((lVar8 - uVar7) - (long)pcVar4) < (long)uVar9) {
      uVar3 = lVar6 * 2;
      if (lVar6 * 2 < (long)uVar9) {
        uVar3 = uVar9;
      }
      if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar8 - (long)pcVar4 < (long)uVar3)) goto LAB_001ab2e3;
      goto LAB_001ab306;
    }
LAB_001ab30f:
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001ab327;
  }
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001ab327:
  __dest = (a->d).ptr + (a->d).size;
  pcVar4 = *b->a;
  cVar2 = *pcVar4;
  while (cVar2 != '\0') {
    pcVar4 = pcVar4 + 1;
    *__dest = cVar2;
    __dest = __dest + 1;
    cVar2 = *pcVar4;
  }
  __n = (b->b).d.size;
  if (__n != 0) {
    memcpy(__dest,(b->b).d.ptr,__n);
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}